

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

bool ThreadContext::IsCurrentStackAvailable(size_t size)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ThreadContext *this;
  ThreadContext *this_00;
  undefined4 *puVar4;
  size_t sVar5;
  undefined8 uVar6;
  PVOID in_RCX;
  ScriptContext *scriptContext;
  size_t in_RSI;
  ThreadContext *this_01;
  
  this_01 = (ThreadContext *)size;
  this = (ThreadContext *)ThreadContextTLSEntry::GetEntryForCurrentThread();
  if (this != (ThreadContext *)0x0) {
    this_00 = ThreadContextTLSEntry::GetThreadContext((ThreadContextTLSEntry *)this);
    this_01 = this;
    if (this_00 != (ThreadContext *)0x0) {
      bVar2 = IsStackAvailable(this_00,size,(bool *)0x0);
      return bVar2;
    }
  }
  IsCurrentStackAvailable();
  BVar3 = ExceptionCheck::CanHandleStackOverflow(false);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x68c,"(ExceptionCheck::CanHandleStackOverflow(false))",
                       "ExceptionCheck::CanHandleStackOverflow(false)");
    if (!bVar2) goto LAB_007afc88;
    *puVar4 = 0;
  }
  bVar2 = IsStackAvailable(this_01,in_RSI,(bool *)0x0);
  if (bVar2) {
    return bVar2;
  }
  sVar5 = GetStackLimitForCurrentThread(this_01);
  if (sVar5 != 0x7fffffffffffffff) {
    Js::Throw::StackOverflow(scriptContext,in_RCX);
  }
  bVar2 = DoInterruptProbe(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x692,"(this->DoInterruptProbe())","this->DoInterruptProbe()");
    if (!bVar2) {
LAB_007afc88:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar6 = __cxa_allocate_exception(1);
  __cxa_throw(uVar6,&Js::ScriptAbortException::typeinfo,0);
}

Assistant:

bool
ThreadContext::IsCurrentStackAvailable(size_t size)
{
    ThreadContext *currentContext = GetContextForCurrentThread();
    Assert(currentContext);

    return currentContext->IsStackAvailable(size);
}